

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfScene(Scene *scene,json *o)

{
  char cVar1;
  long lVar2;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  Scene *scene_local;
  
  local_18 = o;
  o_local = (json *)scene;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"nodes",&local_39);
  SerializeNumberArrayProperty<int>
            (&local_38,(vector<int,_std::allocator<int>_> *)(o_local + 2),local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"name",&local_71);
    SerializeStringProperty(&local_70,(string *)o_local,local_18);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  cVar1 = Value::Type((Value *)&o_local[6].m_value);
  if (cVar1 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"extras",&local_99);
    SerializeValue(&local_98,(Value *)&o_local[6].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  SerializeExtensionMap((ExtensionMap *)&o_local[3].m_value,local_18);
  return;
}

Assistant:

static void SerializeGltfScene(Scene &scene, json &o) {
  SerializeNumberArrayProperty<int>("nodes", scene.nodes, o);

  if (scene.name.size()) {
    SerializeStringProperty("name", scene.name, o);
  }
  if (scene.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", scene.extras, o);
  }
  SerializeExtensionMap(scene.extensions, o);
}